

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_AUTH_RESPONSE_Unmarshal(TPMS_AUTH_RESPONSE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPM2B_DIGEST_Unmarshal(&target->nonce,buffer,size);
  if (TVar1 == 0) {
    TVar1 = UINT8_Unmarshal((UINT8 *)&target->sessionAttributes,buffer,size);
    if ((TVar1 == 0) && (TVar1 = 0xa1, ((uint)target->sessionAttributes & 0x18) == 0)) {
      TVar1 = TPM2B_DIGEST_Unmarshal(&target->hmac,buffer,size);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_AUTH_RESPONSE_Unmarshal(TPMS_AUTH_RESPONSE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_NONCE_Unmarshal((TPM2B_NONCE *)&(target->nonce), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_SESSION_Unmarshal((TPMA_SESSION *)&(target->sessionAttributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_AUTH_Unmarshal((TPM2B_AUTH *)&(target->hmac), buffer, size);
    return result;
}